

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderDockWindow(char *window_name,ImGuiID node_id)

{
  int iVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  ImU32 key;
  ImGuiWindow *window;
  ImGuiWindowSettings *pIVar4;
  ImGuiWindowSettings *pIVar5;
  ImGuiContext *g;
  
  key = ImHashStr(window_name,0,0);
  pIVar3 = GImGui;
  window = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
  if (window == (ImGuiWindow *)0x0) {
    pcVar2 = (pIVar3->SettingsWindows).Buf.Data;
    if (pcVar2 != (char *)0x0) {
      pIVar5 = (ImGuiWindowSettings *)(pcVar2 + 4);
      pIVar4 = pIVar5;
      do {
        if (pIVar4->ID == key) goto LAB_001683ec;
        iVar1._0_2_ = pIVar4[-1].DockOrder;
        iVar1._2_1_ = pIVar4[-1].Collapsed;
        iVar1._3_1_ = pIVar4[-1].field_0x1f;
        pIVar4 = (ImGuiWindowSettings *)((long)&pIVar4->ID + (long)iVar1);
      } while (pIVar4 != (ImGuiWindowSettings *)
                         ((long)&pIVar5->ID + (long)(pIVar3->SettingsWindows).Buf.Size));
    }
    pIVar4 = CreateNewWindowSettings(window_name);
LAB_001683ec:
    pIVar4->DockId = node_id;
    pIVar4->DockOrder = -1;
  }
  else {
    SetWindowDock(window,node_id,1);
    window->DockOrder = -1;
  }
  return;
}

Assistant:

void ImGui::DockBuilderDockWindow(const char* window_name, ImGuiID node_id)
{
    // We don't preserve relative order of multiple docked windows (by clearing DockOrder back to -1)
    ImGuiID window_id = ImHashStr(window_name);
    if (ImGuiWindow* window = FindWindowByID(window_id))
    {
        // Apply to created window
        SetWindowDock(window, node_id, ImGuiCond_Always);
        window->DockOrder = -1;
    }
    else
    {
        // Apply to settings
        ImGuiWindowSettings* settings = FindWindowSettings(window_id);
        if (settings == NULL)
            settings = CreateNewWindowSettings(window_name);
        settings->DockId = node_id;
        settings->DockOrder = -1;
    }
}